

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

HighsStatus __thiscall HEkkPrimal::solve(HEkkPrimal *this,bool pass_force_phase2)

{
  double *pdVar1;
  HighsLogOptions *pHVar2;
  HighsInt *pHVar3;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  double dVar4;
  uint uVar5;
  int iVar6;
  HighsInt HVar7;
  HighsOptions *pHVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  HighsDebugStatus HVar12;
  HighsStatus HVar13;
  HighsStatus HVar14;
  int iVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  HEkk *this_01;
  HEkk *pHVar17;
  HEkkDual dual_solver;
  string local_2ba8;
  string local_2b88;
  HighsLogOptions local_2b68;
  HEkkDual local_2b08;
  
  uVar16 = CONCAT71(in_register_00000031,pass_force_phase2) & 0xffffffff;
  initialiseSolve(this);
  bVar9 = HEkk::isUnconstrainedLp(this->ekk_instance_);
  this_01 = this->ekk_instance_;
  if (bVar9) {
LAB_0035e1b1:
    HVar13 = HEkk::returnFromSolve(this_01,kError);
    return HVar13;
  }
  pHVar8 = this_01->options_;
  if ((this_01->status_).has_invert == false) {
    highsLogDev(&(pHVar8->super_HighsOptionsStruct).log_options,kError,
                "HEkkPrimal::solve called without INVERT\n");
    this_01 = this->ekk_instance_;
    goto LAB_0035e1b1;
  }
  local_2b88._M_dataplus._M_p = (pointer)&local_2b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b88,"Initialise","");
  HVar12 = debugPrimalSimplex(this,&local_2b88,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b88._M_dataplus._M_p != &local_2b88.field_2) {
    operator_delete(local_2b88._M_dataplus._M_p);
  }
  if (HVar12 == kLogicalError) {
LAB_0035e184:
    pHVar17 = this->ekk_instance_;
  }
  else {
    getNonbasicFreeColumnSet(this);
    bVar9 = true;
    if ((char)uVar16 == '\0') {
      dVar4 = (this_01->info_).max_primal_infeasibility;
      bVar9 = dVar4 * dVar4 < (pHVar8->super_HighsOptionsStruct).primal_feasibility_tolerance;
    }
    if ((999 < (this_01->info_).num_dual_infeasibilities) ||
       (pdVar1 = &(this_01->info_).max_dual_infeasibility, 0.001 < *pdVar1 || *pdVar1 == 0.001)) {
      bVar10 = 0;
    }
    else {
      bVar10 = (this_01->info_).num_primal_infeasibilities == 0 | bVar9;
    }
    if (bVar10 == 0) {
      dVar4 = (this_01->info_).primal_simplex_bound_perturbation_multiplier;
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        HEkk::initialiseBound(this->ekk_instance_,kPrimal,-1,true);
        HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
        HEkk::computePrimal(this->ekk_instance_);
        HEkk::computeSimplexPrimalInfeasible(this->ekk_instance_);
      }
    }
    else {
      pHVar2 = &(pHVar8->super_HighsOptionsStruct).log_options;
      highsLogDev(pHVar2,kDetailed,
                  "Primal feasible and num / max / sum dual infeasibilities of %d / %g / %g, so near-optimal\n"
                  ,(this_01->info_).max_dual_infeasibility,(this_01->info_).sum_dual_infeasibilities
                 );
      highsLogDev(pHVar2,kDetailed,"Near-optimal, so don\'t use bound perturbation\n");
    }
    bVar11 = HEkk::bailout(this->ekk_instance_);
    pHVar17 = this->ekk_instance_;
    if (bVar11) {
      HVar13 = kWarning;
      goto LAB_0035e2d2;
    }
    iVar15 = (byte)(bVar9 | (pHVar17->info_).num_primal_infeasibilities < 1) + 1;
    this->solve_phase = iVar15;
    HVar12 = HEkk::debugOkForSolve(pHVar17,kPrimal,iVar15);
    if (HVar12 == kLogicalError) goto LAB_0035e184;
    std::vector<double,_std::allocator<double>_>::resize
              (&(this_01->info_).backtracking_basis_edge_weight_,(long)this->num_tot);
    if (this->report_hyper_chuzc == true) {
      uVar5 = this->ekk_instance_->iteration_count_;
      uVar16 = (ulong)uVar5;
      puts(" Iter ColIn Row_Out ColOut");
      this->last_header_iteration_count_ = uVar5;
    }
    if (this->primal_correction_strategy != 0) {
      this->max_max_primal_correction_ = 0.0;
    }
    pHVar2 = &(pHVar8->super_HighsOptionsStruct).log_options;
    do {
      HVar13 = (HighsStatus)uVar16;
      iVar15 = this->solve_phase;
      if (iVar15 == 0) goto LAB_0035e4e1;
      pHVar17 = this->ekk_instance_;
      iVar6 = pHVar17->iteration_count_;
      (this_01->status_).has_primal_objective_value = false;
      if (iVar15 == -1) {
        HEkk::computeSimplexPrimalInfeasible(pHVar17);
        iVar15 = ((this->ekk_instance_->info_).num_primal_infeasibilities < 1) + 1;
        this->solve_phase = iVar15;
        if ((this_01->info_).backtracking_ == true) {
          HEkk::initialiseCost(this->ekk_instance_,kPrimal,iVar15,false);
          HEkk::initialiseNonbasicValueAndMove(this->ekk_instance_);
          (this_01->info_).backtracking_ = false;
        }
      }
      if (this->solve_phase != 2) {
        if (this->solve_phase == 1) {
          solvePhase1(this);
          pHVar3 = &(this_01->info_).primal_phase1_iteration_count;
          *pHVar3 = *pHVar3 + (this->ekk_instance_->iteration_count_ - iVar6);
          goto LAB_0035e41b;
        }
        pHVar17 = this->ekk_instance_;
switchD_0035e458_caseD_fffffffd:
        pHVar17->model_status_ = kSolveError;
        HVar13 = HEkk::returnFromSolve(pHVar17,kError);
        uVar16 = (ulong)(uint)HVar13;
        iVar15 = 1;
        goto switchD_0035e458_caseD_4;
      }
      solvePhase2(this);
      pHVar3 = &(this_01->info_).primal_phase2_iteration_count;
      *pHVar3 = *pHVar3 + (this->ekk_instance_->iteration_count_ - iVar6);
LAB_0035e41b:
      pHVar17 = this->ekk_instance_;
      if (pHVar17->solve_bailout_ == true) {
LAB_0035e42d:
        iVar15 = 1;
        HVar13 = HEkk::returnFromSolve(pHVar17,kWarning);
        uVar16 = (ulong)(uint)HVar13;
      }
      else {
        iVar15 = 3;
        switch(this->solve_phase) {
        case 4:
          break;
        case 5:
          highsLogDev(pHVar2,kInfo,"HEkkPrimal::solve Only basis change is taboo\n");
          pHVar17 = this->ekk_instance_;
          pHVar17->model_status_ = kUnknown;
          goto LAB_0035e42d;
        case -3:
          goto switchD_0035e458_caseD_fffffffd;
        case -2:
          if (pHVar17->model_status_ == kInfeasible) {
            std::vector<double,_std::allocator<double>_>::operator=
                      (&pHVar17->primal_phase1_dual_,&(pHVar17->info_).workDual_);
          }
          break;
        default:
          iVar15 = 0;
        }
      }
switchD_0035e458_caseD_4:
      HVar13 = (HighsStatus)uVar16;
    } while (iVar15 == 0);
    if (iVar15 != 3) {
      return HVar13;
    }
LAB_0035e4e1:
    if (this->solve_phase == 4) {
      highsLogDev(pHVar2,kInfo,
                  "HEkkPrimal:: Using dual simplex to try to clean up num / max / sum = %d / %g / %g primal infeasibilities\n"
                  ,(this_01->info_).max_primal_infeasibility,
                  (this_01->info_).sum_primal_infeasibilities,
                  (ulong)(uint)(this_01->info_).num_primal_infeasibilities);
      HEkk::computePrimalObjectiveValue(this->ekk_instance_);
      HighsSimplexAnalysis::simplexTimerStart(this->analysis,3,0);
      dVar4 = (this_01->info_).dual_simplex_cost_perturbation_multiplier;
      (this_01->info_).dual_simplex_cost_perturbation_multiplier = 0.0;
      HVar7 = (this_01->info_).simplex_strategy;
      (this_01->info_).simplex_strategy = 1;
      HEkkDual::HEkkDual(&local_2b08,this->ekk_instance_);
      HVar14 = HEkkDual::solve(&local_2b08,true);
      (this_01->info_).dual_simplex_cost_perturbation_multiplier = dVar4;
      (this_01->info_).simplex_strategy = HVar7;
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,3,0);
      local_2b68.log_stream = pHVar2->log_stream;
      local_2b68.output_flag = (pHVar8->super_HighsOptionsStruct).log_options.output_flag;
      local_2b68.log_to_console = (pHVar8->super_HighsOptionsStruct).log_options.log_to_console;
      local_2b68.log_dev_level = (pHVar8->super_HighsOptionsStruct).log_options.log_dev_level;
      local_2b68.user_log_callback =
           (pHVar8->super_HighsOptionsStruct).log_options.user_log_callback;
      local_2b68.user_log_callback_data =
           (pHVar8->super_HighsOptionsStruct).log_options.user_log_callback_data;
      this_00 = &local_2b68.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(this_00,&(pHVar8->super_HighsOptionsStruct).log_options.user_callback);
      local_2b68.user_callback_active =
           (pHVar8->super_HighsOptionsStruct).log_options.user_callback_active;
      local_2b68.user_callback_data =
           (pHVar8->super_HighsOptionsStruct).log_options.user_callback_data;
      local_2ba8._M_dataplus._M_p = (pointer)&local_2ba8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2ba8,"HEkkDual::solve","");
      HVar14 = interpretCallStatus(&local_2b68,HVar14,kOk,&local_2ba8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2ba8._M_dataplus._M_p != &local_2ba8.field_2) {
        operator_delete(local_2ba8._M_dataplus._M_p);
      }
      if (local_2b68.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_2b68.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      pHVar17 = this->ekk_instance_;
      pHVar17->called_return_from_solve_ = false;
      if (HVar14 == kOk) {
        if ((pHVar17->model_status_ == kOptimal) &&
           ((this_01->info_).num_primal_infeasibilities + (this_01->info_).num_dual_infeasibilities
            != 0)) {
          highsLogDev(pHVar2,kWarning,
                      "HEkkPrimal:: Dual simplex clean up yields  optimality, but with %d (max %g) primal infeasibilities and d (max %g) dual infeasibilities\n"
                      ,(this_01->info_).max_primal_infeasibility,
                      (this_01->info_).max_dual_infeasibility);
        }
      }
      else {
        HVar13 = HEkk::returnFromSolve(pHVar17,HVar14);
      }
      HEkkDual::~HEkkDual(&local_2b08);
      if (HVar14 != kOk) {
        return HVar13;
      }
    }
    else if (this->solve_phase == 0) {
      this->ekk_instance_->model_status_ = kOptimal;
    }
    HVar12 = HEkk::debugOkForSolve(this->ekk_instance_,kPrimal,this->solve_phase);
    pHVar17 = this->ekk_instance_;
    if (HVar12 != kLogicalError) {
      HVar13 = kOk;
      goto LAB_0035e2d2;
    }
  }
  HVar13 = kError;
LAB_0035e2d2:
  HVar13 = HEkk::returnFromSolve(pHVar17,HVar13);
  return HVar13;
}

Assistant:

HighsStatus HEkkPrimal::solve(const bool pass_force_phase2) {
  // Initialise control data for a particular solve
  initialiseSolve();
  // Assumes that the LP has a positive number of rows
  if (ekk_instance_.isUnconstrainedLp())
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;

  if (!status.has_invert) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HEkkPrimal::solve called without INVERT\n");
    assert(status.has_fresh_invert);
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  if (debugPrimalSimplex("Initialise", true) == HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  // Get the nonbasic free column set
  getNonbasicFreeColumnSet();

  const bool primal_feasible_with_unperturbed_bounds =
      info.num_primal_infeasibilities == 0;
  const bool force_phase2 =
      pass_force_phase2 ||
      info.max_primal_infeasibility * info.max_primal_infeasibility <
          options.primal_feasibility_tolerance;
  // Determine whether the solution is near-optimal. Values 1000 and
  // 1e-3 (ensuring sum<1) are unimportant, as the sum of dual
  // infeasibilities for near-optimal solutions is typically many
  // orders of magnitude smaller than 1, and the sum of dual
  // infeasibilities will be very much larger for non-trivial LPs
  // that are primal feasible for a logical or crash basis.
  //
  // Consider there to be no primal infeasibilities if there are none,
  // or if phase 2 is forced, in which case any primal infeasibilities
  // will be shifted
  const bool no_simplex_primal_infeasibilities =
      primal_feasible_with_unperturbed_bounds || force_phase2;
  const bool near_optimal = info.num_dual_infeasibilities < 1000 &&
                            info.max_dual_infeasibility < 1e-3 &&
                            no_simplex_primal_infeasibilities;
  // For reporting, save primal infeasibility data for the LP without
  // bound perturbations
  const HighsInt unperturbed_num_infeasibilities =
      info.num_primal_infeasibilities;
  const double unperturbed_max_infeasibility = info.max_primal_infeasibility;
  const double unperturbed_sum_infeasibilities =
      info.sum_primal_infeasibilities;
  if (near_optimal)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Primal feasible and num / max / sum "
                "dual infeasibilities of "
                "%" HIGHSINT_FORMAT
                " / %g "
                "/ %g, so near-optimal\n",
                info.num_dual_infeasibilities, info.max_dual_infeasibility,
                info.sum_dual_infeasibilities);

  // Perturb bounds according to whether the solution is near-optimal
  const bool perturb_bounds = !near_optimal;
  if (!perturb_bounds)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Near-optimal, so don't use bound perturbation\n");
  if (perturb_bounds && info.primal_simplex_bound_perturbation_multiplier) {
    ekk_instance_.initialiseBound(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown,
                                  perturb_bounds);
    ekk_instance_.initialiseNonbasicValueAndMove();
    ekk_instance_.computePrimal();
    ekk_instance_.computeSimplexPrimalInfeasible();
  }

  // Check whether the time/iteration limit has been reached. First
  // point at which a non-error return can occur
  if (ekk_instance_.bailout())
    return ekk_instance_.returnFromSolve(HighsStatus::kWarning);

  // Now to do some iterations!
  HighsInt num_primal_infeasibility =
      ekk_instance_.info_.num_primal_infeasibilities;
  solve_phase = num_primal_infeasibility > 0 ? kSolvePhase1 : kSolvePhase2;
  if (force_phase2) {
    // Dual infeasibilities without cost perturbation involved
    // fixed variables or were (at most) small, so can easily be
    // removed by flips for and fixed variables shifts for the rest
    solve_phase = kSolvePhase2;
    if (!pass_force_phase2) {
      const bool local_report = false;  // true;
      if (!primal_feasible_with_unperturbed_bounds && local_report) {
        printf(
            "Solve %d: Forcing phase 2 since near primal feasible with "
            "unperturbed "
            "costs\n"
            "num / max / sum primal infeasibilities\n"
            "%d / %11.4g / %11.4g (  perturbed bounds)\n"
            "%d / %11.4g / %11.4g (unperturbed bounds)\n",
            (int)ekk_instance_.debug_solve_call_num_,
            (int)info.num_primal_infeasibilities, info.max_primal_infeasibility,
            info.sum_primal_infeasibilities,
            (int)unperturbed_num_infeasibilities, unperturbed_max_infeasibility,
            unperturbed_sum_infeasibilities);
      }
    }
  }
  if (ekk_instance_.debugOkForSolve(algorithm, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  // Resize the copy of scattered edge weights for backtracking
  info.backtracking_basis_edge_weight_.resize(num_tot);

  // The major solving loop
  //
  // Possibly write out the column header for iteration reports, and
  // initialise records for primal correction reporting
  localReportIter(true);
  correctPrimal(true);
  while (solve_phase) {
    HighsInt it0 = ekk_instance_.iteration_count_;
    // When starting a new phase the (updated) primal objective function
    // value isn't known. Indicate this so that when the value
    // computed from scratch in rebuild() isn't checked against the
    // updated value
    status.has_primal_objective_value = false;
    if (solve_phase == kSolvePhaseUnknown) {
      // Determine the number of primal infeasibilities, and hence the solve
      // phase
      ekk_instance_.computeSimplexPrimalInfeasible();
      num_primal_infeasibility = ekk_instance_.info_.num_primal_infeasibilities;
      solve_phase = num_primal_infeasibility > 0 ? kSolvePhase1 : kSolvePhase2;
      if (info.backtracking_) {
        // Backtracking
        ekk_instance_.initialiseCost(SimplexAlgorithm::kPrimal, solve_phase);
        ekk_instance_.initialiseNonbasicValueAndMove();
        // Can now forget that we might have been backtracking
        info.backtracking_ = false;
      }
    }
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    if (solve_phase == kSolvePhase1) {
      //
      // Phase 1
      //
      // solve_phase = kSolvePhase1 if the iteration or time limit has
      // been reached
      //
      // solve_phase = kSolvePhase2 if there are no primal infeasibilities
      //
      // solve_phase = kSolvePhaseUnknown if backtracking
      //
      // solve_phase = kSolvePhaseExit if primal infeasibility is
      // detected, in which case model_status_ =
      // HighsModelStatus::kInfeasible is set
      //
      // solve_phase = kSolvePhaseTabooBasis is set if only basis change is
      // taboo
      //
      // solve_phase = kSolvePhaseError is set if an error occurs
      solvePhase1();
      assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2 ||
             solve_phase == kSolvePhaseUnknown ||
             solve_phase == kSolvePhaseExit ||
             solve_phase == kSolvePhaseTabooBasis ||
             solve_phase == kSolvePhaseError);
      info.primal_phase1_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else if (solve_phase == kSolvePhase2) {
      //
      // Phase 2
      //
      // solve_phase = kSolvePhaseOptimal if there are no dual
      // infeasibilities
      //
      // solve_phase = kSolvePhase1 if there are primal
      // infeasibilities
      //
      // solve_phase = kSolvePhase2 if the iteration or time limit has
      // been reached
      //
      // solve_phase = kSolvePhaseOptimalCleanup if, after removing bound
      // shifts, there are primal infeasibilities to clean up
      //
      // solve_phase = kSolvePhaseUnknown if backtracking
      //
      // solve_phase = kSolvePhaseExit if primal unboundedness is
      // detected, in which case model_status_ =
      // HighsModelStatus::kUnbounded is set
      //
      // solve_phase = kSolvePhaseTabooBasis is set if only basis change is
      // taboo
      //
      // solve_phase = kSolvePhaseError is set if an error occurs
      solvePhase2();
      assert(solve_phase == kSolvePhaseOptimal || solve_phase == kSolvePhase1 ||
             solve_phase == kSolvePhase2 ||
             solve_phase == kSolvePhaseOptimalCleanup ||
             solve_phase == kSolvePhaseUnknown ||
             solve_phase == kSolvePhaseExit ||
             solve_phase == kSolvePhaseTabooBasis ||
             solve_phase == kSolvePhaseError);
      assert(solve_phase != kSolvePhaseExit ||
             ekk_instance_.model_status_ == HighsModelStatus::kUnbounded);
      info.primal_phase2_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else {
      // Should only be kSolvePhase1 or kSolvePhase2
      ekk_instance_.model_status_ = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    // Return if bailing out from solve
    if (ekk_instance_.solve_bailout_)
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    // Can have all possible cases of solve_phase
    assert(solve_phase >= kSolvePhaseMin && solve_phase <= kSolvePhaseMax);
    // Look for scenarios when the major solving loop ends
    if (solve_phase == kSolvePhaseTabooBasis) {
      // Only basis change is taboo so return HighsStatus::kWarning
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "HEkkPrimal::solve Only basis change is taboo\n");
      ekk_instance_.model_status_ = HighsModelStatus::kUnknown;
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    }
    if (solve_phase == kSolvePhaseError) {
      // Solver error so return HighsStatus::kError
      ekk_instance_.model_status_ = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    if (solve_phase == kSolvePhaseExit) {
      // LP identified as not having an optimal solution
      assert(ekk_instance_.model_status_ == HighsModelStatus::kInfeasible ||
             ekk_instance_.model_status_ == HighsModelStatus::kUnbounded);
      // If infeasible, save the primal phase 1 dual values before
      // they are overwritten with the duals for the original
      // objective
      if (ekk_instance_.model_status_ == HighsModelStatus::kInfeasible)
        ekk_instance_.primal_phase1_dual_ = ekk_instance_.info_.workDual_;
      break;
    }
    if (solve_phase == kSolvePhaseOptimalCleanup) {
      // Primal infeasibilities after phase 2. Dual feasible with
      // primal infeasibilities so use dual simplex to clean up
      break;
    }
    // If solve_phase == kSolvePhaseOptimal == 0 then major solving
    // loop ends naturally since solve_phase is false
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Should only have these cases
  assert(solve_phase ==
             kSolvePhaseExit ||  // solve_phase == kSolvePhaseUnknown ||
         solve_phase == kSolvePhaseOptimal ||  // solve_phase == kSolvePhase1 ||
         solve_phase == kSolvePhaseOptimalCleanup);
  if (solve_phase == kSolvePhaseOptimal)
    ekk_instance_.model_status_ = HighsModelStatus::kOptimal;

  if (solve_phase == kSolvePhaseOptimalCleanup) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "HEkkPrimal:: Using dual simplex to try to clean up num / "
                "max / sum = %" HIGHSINT_FORMAT
                " / %g / %g primal infeasibilities\n",
                info.num_primal_infeasibilities, info.max_primal_infeasibility,
                info.sum_primal_infeasibilities);
    ekk_instance_.computePrimalObjectiveValue();
    // Use dual to clean up. This almost always yields optimality,
    // and shouldn't yield infeasibility - since the current point
    // is dual feasible - but can yield
    // unboundedness. Time/iteration limit return is, of course,
    // possible, as are solver error
    HighsStatus return_status = HighsStatus::kOk;
    analysis->simplexTimerStart(SimplexDualPhase2Clock);
    // Switch off any bound perturbation
    double save_dual_simplex_cost_perturbation_multiplier =
        info.dual_simplex_cost_perturbation_multiplier;
    info.dual_simplex_cost_perturbation_multiplier = 0;
    HighsInt simplex_strategy = info.simplex_strategy;
    info.simplex_strategy = kSimplexStrategyDualPlain;
    HEkkDual dual_solver(ekk_instance_);
    HighsStatus call_status = dual_solver.solve(true);
    // Restore any bound perturbation
    info.dual_simplex_cost_perturbation_multiplier =
        save_dual_simplex_cost_perturbation_multiplier;
    info.simplex_strategy = simplex_strategy;
    analysis->simplexTimerStop(SimplexDualPhase2Clock);
    assert(ekk_instance_.called_return_from_solve_);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "HEkkDual::solve");
    // Reset called_return_from_solve_ to be false, since it's
    // called for this solve
    ekk_instance_.called_return_from_solve_ = false;
    if (return_status != HighsStatus::kOk)
      return ekk_instance_.returnFromSolve(return_status);
    if (ekk_instance_.model_status_ == HighsModelStatus::kOptimal &&
        info.num_primal_infeasibilities + info.num_dual_infeasibilities)
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  "HEkkPrimal:: Dual simplex clean up yields  optimality, but "
                  "with %" HIGHSINT_FORMAT
                  " (max %g) primal infeasibilities and " HIGHSINT_FORMAT
                  " (max %g) dual infeasibilities\n",
                  info.num_primal_infeasibilities,
                  info.max_primal_infeasibility, info.num_dual_infeasibilities,
                  info.max_dual_infeasibility);
  }
  if (ekk_instance_.debugOkForSolve(algorithm, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  return ekk_instance_.returnFromSolve(HighsStatus::kOk);
}